

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_get_token2(char **ptr,char *delimiter,char **token,int *isanumber,int *status)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  char *pcVar4;
  int *piVar5;
  double dval;
  char local_98 [4];
  int slen;
  char tval [73];
  char *local_40;
  char *loc;
  int *status_local;
  int *isanumber_local;
  char **token_local;
  char *delimiter_local;
  char **ptr_local;
  
  if (*status == 0) {
    while (**ptr == ' ') {
      *ptr = *ptr + 1;
    }
    loc = (char *)status;
    status_local = isanumber;
    isanumber_local = (int *)token;
    token_local = (char **)delimiter;
    delimiter_local = (char *)ptr;
    sVar2 = strcspn(*ptr,delimiter);
    iVar1 = (int)sVar2;
    ptr_local._4_4_ = iVar1;
    if (iVar1 != 0) {
      pvVar3 = calloc((long)(iVar1 + 1),1);
      *(void **)isanumber_local = pvVar3;
      if (*(long *)isanumber_local == 0) {
        ffpmsg("Couldn\'t allocate memory to hold token string (fits_get_token2).");
        loc[0] = 'q';
        loc[1] = '\0';
        loc[2] = '\0';
        loc[3] = '\0';
        ptr_local._4_4_ = 0;
      }
      else {
        strncat(*(char **)isanumber_local,*(char **)delimiter_local,(long)iVar1);
        *(long *)delimiter_local = *(long *)delimiter_local + (long)iVar1;
        if (status_local != (int *)0x0) {
          *status_local = 1;
          pcVar4 = strchr(*(char **)isanumber_local,0x44);
          if (pcVar4 == (char *)0x0) {
            strtod(*(char **)isanumber_local,&local_40);
          }
          else {
            strncpy(local_98,*(char **)isanumber_local,0x48);
            tval[0x40] = '\0';
            local_40 = strchr(local_98,0x44);
            if (local_40 != (char *)0x0) {
              *local_40 = 'E';
            }
            strtod(local_98,&local_40);
          }
          if ((*local_40 != '\0') && (*local_40 != ' ')) {
            *status_local = 0;
          }
          piVar5 = __errno_location();
          if (*piVar5 == 0x22) {
            *status_local = 0;
          }
        }
      }
    }
  }
  else {
    ptr_local._4_4_ = 0;
  }
  return ptr_local._4_4_;
}

Assistant:

int fits_get_token2(char **ptr, 
                   char *delimiter,
                   char **token,
                   int *isanumber,  /* O - is this token a number? */
		   int *status)

/*
   parse off the next token, delimited by a character in 'delimiter',
   from the input ptr string;  increment *ptr to the end of the token.
   Returns the length of the token, not including the delimiter char;

   This routine allocates the *token string;  the calling routine must free it 
*/
{
    char *loc, tval[73];
    int slen;
    double dval;
    
    if (*status)
        return(0);
	
    while (**ptr == ' ')  /* skip over leading blanks */
        (*ptr)++;

    slen = strcspn(*ptr, delimiter);  /* length of next token */
    if (slen)
    {
	*token = (char *) calloc(slen + 1, 1); 
	if (!(*token)) {
          ffpmsg("Couldn't allocate memory to hold token string (fits_get_token2).");
          *status = MEMORY_ALLOCATION ;
	  return(0);
        }
 
        strncat(*token, *ptr, slen);       /* copy token */
        (*ptr) += slen;                   /* skip over the token */

        if (isanumber)  /* check if token is a number */
        {
            *isanumber = 1;

	    if (strchr(*token, 'D'))  {
	        strncpy(tval, *token, 72);
		tval[72] = '\0';

	        /*  The C language does not support a 'D'; replace with 'E' */
	        if ((loc = strchr(tval, 'D'))) *loc = 'E';

	        dval =  strtod(tval, &loc);
	    } else {
	        dval =  strtod(*token, &loc);
 	    }

	    /* check for read error, or junk following the value */
	    if (*loc != '\0' && *loc != ' ' ) *isanumber = 0;
	    if (errno == ERANGE) *isanumber = 0;
        }
    }

    return(slen);
}